

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g2d.c
# Opt level: O3

int g2d_polygon_contains_point_ref(zarray_t *poly,double *q)

{
  uint uVar1;
  uint uVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double p [2];
  double local_60;
  double local_58;
  double local_48;
  double local_40;
  
  if (poly == (zarray_t *)0x0) {
    __assert_fail("za != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/./common/zarray.h"
                  ,0x84,"int zarray_size(const zarray_t *)");
  }
  uVar1 = poly->size;
  if ((int)uVar1 < 0) {
    uVar1 = 0;
  }
  else {
    uVar2 = 0;
    local_60 = 0.0;
    do {
      if (poly->size <= (int)((ulong)uVar2 % (ulong)uVar1)) {
        __assert_fail("idx < za->size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/./common/zarray.h"
                      ,200,"void zarray_get(const zarray_t *, int, void *)");
      }
      memcpy(&local_48,poly->data + ((ulong)uVar2 % (ulong)uVar1) * poly->el_sz,poly->el_sz);
      dVar3 = atan2(q[1] - local_40,*q - local_48);
      if (uVar2 != 0) {
        dVar5 = (dVar3 - local_58) + 3.141592653589793;
        dVar4 = floor(dVar5 / 6.283185307179586);
        local_60 = local_60 + dVar4 * -6.283185307179586 + dVar5 + -3.141592653589793;
      }
      uVar2 = uVar2 + 1;
      local_58 = dVar3;
    } while (uVar1 + 1 != uVar2);
    uVar1 = (uint)(3.141592653589793 < local_60);
  }
  return uVar1;
}

Assistant:

int g2d_polygon_contains_point_ref(const zarray_t *poly, double q[2])
{
    // use winding. If the point is inside the polygon, we'll wrap
    // around it (accumulating 6.28 radians). If we're outside the
    // polygon, we'll accumulate zero.
    int psz = zarray_size(poly);

    double acc_theta = 0;

    double last_theta;

    for (int i = 0; i <= psz; i++) {
        double p[2];

        zarray_get(poly, i % psz, &p);

        double this_theta = atan2(q[1]-p[1], q[0]-p[0]);

        if (i != 0)
            acc_theta += mod2pi(this_theta - last_theta);

        last_theta = this_theta;
    }

    return acc_theta > M_PI;
}